

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall
spirv_cross::ParsedIR::make_constant_null
          (ParsedIR *this,uint32_t id,uint32_t type,bool add_to_typed_id_set)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  size_t sVar5;
  Variant *pVVar6;
  bool *pbVar7;
  uint *puVar8;
  ulong uVar9;
  TypedID *this_00;
  SPIRConstant *pSVar10;
  uint local_140;
  TypedID<(spirv_cross::Types)0> local_124;
  SPIRConstant *local_120;
  SPIRConstant *constant_2;
  bool local_10d;
  uint local_10c;
  uint *local_108;
  TypedID<(spirv_cross::Types)0> local_fc;
  ID local_f8;
  uint local_f4;
  undefined1 local_f0 [4];
  uint32_t i_1;
  SmallVector<unsigned_int,_8UL> elements_1;
  uint32_t member_ids;
  uint local_ac;
  uint *local_a8;
  SPIRConstant *local_a0;
  SPIRConstant *constant_1;
  ID local_88;
  uint local_84;
  undefined1 local_80 [4];
  uint32_t i;
  SmallVector<unsigned_int,_8UL> elements;
  uint32_t count;
  TypedID<(spirv_cross::Types)0> TStack_3c;
  bool is_literal_array_size;
  uint32_t parent_id;
  SPIRConstant *constant;
  SPIRType *local_28;
  SPIRType *constant_type;
  uint32_t local_18;
  uint32_t uStack_14;
  bool add_to_typed_id_set_local;
  uint32_t type_local;
  uint32_t id_local;
  ParsedIR *this_local;
  
  constant_type._7_1_ = add_to_typed_id_set;
  local_18 = type;
  uStack_14 = id;
  _type_local = this;
  sVar5 = VectorView<spirv_cross::Variant>::size
                    (&(this->ids).super_VectorView<spirv_cross::Variant>);
  if (sVar5 <= id) {
    __assert_fail("id < ids.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                  ,0x40b,"void spirv_cross::ParsedIR::make_constant_null(uint32_t, uint32_t, bool)")
    ;
  }
  local_28 = get<spirv_cross::SPIRType>(this,local_18);
  if ((local_28->pointer & 1U) == 0) {
    bVar1 = VectorView<unsigned_int>::empty(&(local_28->array).super_VectorView<unsigned_int>);
    if (bVar1) {
      bVar1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::empty
                        (&(local_28->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
      if (bVar1) {
        if ((constant_type._7_1_ & 1) != 0) {
          TypedID<(spirv_cross::Types)0>::TypedID
                    ((TypedID<(spirv_cross::Types)0> *)((long)&constant_2 + 4),uStack_14);
          add_typed_id(this,TypeConstant,constant_2._4_4_);
        }
        pVVar6 = VectorView<spirv_cross::Variant>::operator[]
                           (&(this->ids).super_VectorView<spirv_cross::Variant>,(ulong)uStack_14);
        local_120 = variant_set<spirv_cross::SPIRConstant,unsigned_int&>(pVVar6,&local_18);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_124,uStack_14);
        (local_120->super_IVariant).self.id = local_124.id;
        SPIRConstant::make_null(local_120,local_28);
      }
      else {
        sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          (&(local_28->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
        elements_1.stack_storage.aligned_char._24_4_ = increase_bound_by(this,(uint32_t)sVar5);
        sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          (&(local_28->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
        SmallVector<unsigned_int,_8UL>::SmallVector
                  ((SmallVector<unsigned_int,_8UL> *)local_f0,sVar5);
        for (local_f4 = 0; uVar9 = (ulong)local_f4,
            sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                              (&(local_28->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
            uVar9 < sVar5; local_f4 = local_f4 + 1) {
          uVar2 = elements_1.stack_storage.aligned_char._24_4_ + local_f4;
          this_00 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              (&(local_28->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                               (ulong)local_f4);
          uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
          make_constant_null(this,uVar2,uVar3,(bool)(constant_type._7_1_ & 1));
          uVar4 = elements_1.stack_storage.aligned_char._24_4_ + local_f4;
          puVar8 = VectorView<unsigned_int>::operator[]
                             ((VectorView<unsigned_int> *)local_f0,(ulong)local_f4);
          *puVar8 = uVar4;
        }
        if ((constant_type._7_1_ & 1) != 0) {
          TypedID<(spirv_cross::Types)0>::TypedID(&local_f8,uStack_14);
          add_typed_id(this,TypeConstant,local_f8);
        }
        TypedID<(spirv_cross::Types)0>::TypedID(&local_fc,uStack_14);
        pVVar6 = VectorView<spirv_cross::Variant>::operator[]
                           (&(this->ids).super_VectorView<spirv_cross::Variant>,(ulong)uStack_14);
        local_108 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_f0);
        sVar5 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_f0);
        local_10c = (uint)sVar5;
        local_10d = false;
        pSVar10 = variant_set<spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                            (pVVar6,&local_18,&local_108,&local_10c,&local_10d);
        (pSVar10->super_IVariant).self.id = local_fc.id;
        SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_f0);
      }
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_28->parent_type);
      if (uVar2 == 0) {
        __assert_fail("constant_type.parent_type",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                      ,0x419,
                      "void spirv_cross::ParsedIR::make_constant_null(uint32_t, uint32_t, bool)");
      }
      uVar2 = increase_bound_by(this,1);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_28->parent_type);
      make_constant_null(this,uVar2,uVar3,(bool)(constant_type._7_1_ & 1));
      pbVar7 = VectorView<bool>::back(&(local_28->array_size_literal).super_VectorView<bool>);
      elements.stack_storage.aligned_char[0x1f] = *pbVar7 & 1;
      if (elements.stack_storage.aligned_char[0x1f] == 0) {
        local_140 = 1;
      }
      else {
        puVar8 = VectorView<unsigned_int>::back(&(local_28->array).super_VectorView<unsigned_int>);
        local_140 = *puVar8;
      }
      elements.stack_storage.aligned_char[0x18] = (undefined1)local_140;
      elements.stack_storage.aligned_char[0x19] = local_140._1_1_;
      elements.stack_storage.aligned_char[0x1a] = local_140._2_1_;
      elements.stack_storage.aligned_char[0x1b] = local_140._3_1_;
      SmallVector<unsigned_int,_8UL>::SmallVector
                ((SmallVector<unsigned_int,_8UL> *)local_80,(ulong)local_140);
      for (local_84 = 0; local_84 < (uint)elements.stack_storage.aligned_char._24_4_;
          local_84 = local_84 + 1) {
        puVar8 = VectorView<unsigned_int>::operator[]
                           ((VectorView<unsigned_int> *)local_80,(ulong)local_84);
        *puVar8 = uVar2;
      }
      if ((constant_type._7_1_ & 1) != 0) {
        TypedID<(spirv_cross::Types)0>::TypedID(&local_88,uStack_14);
        add_typed_id(this,TypeConstant,local_88);
      }
      pVVar6 = VectorView<spirv_cross::Variant>::operator[]
                         (&(this->ids).super_VectorView<spirv_cross::Variant>,(ulong)uStack_14);
      local_a8 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_80);
      sVar5 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_80);
      local_ac = (uint)sVar5;
      member_ids._3_1_ = 0;
      local_a0 = variant_set<spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                           (pVVar6,&local_18,&local_a8,&local_ac,(bool *)((long)&member_ids + 3));
      TypedID<(spirv_cross::Types)0>::TypedID
                ((TypedID<(spirv_cross::Types)0> *)(elements_1.stack_storage.aligned_char + 0x1c),
                 uStack_14);
      (local_a0->super_IVariant).self.id = elements_1.stack_storage.aligned_char._28_4_;
      local_a0->is_null_array_specialized_length =
           (bool)((elements.stack_storage.aligned_char[0x1f] ^ 0xffU) & 1);
      SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_80);
    }
  }
  else {
    if ((constant_type._7_1_ & 1) != 0) {
      TypedID<(spirv_cross::Types)0>::TypedID
                ((TypedID<(spirv_cross::Types)0> *)((long)&constant + 4),uStack_14);
      add_typed_id(this,TypeConstant,constant._4_4_);
    }
    pVVar6 = VectorView<spirv_cross::Variant>::operator[]
                       (&(this->ids).super_VectorView<spirv_cross::Variant>,(ulong)uStack_14);
    _parent_id = variant_set<spirv_cross::SPIRConstant,unsigned_int&>(pVVar6,&local_18);
    TypedID<(spirv_cross::Types)0>::TypedID(&stack0xffffffffffffffc4,uStack_14);
    (_parent_id->super_IVariant).self.id = TStack_3c.id;
    SPIRConstant::make_null(_parent_id,local_28);
  }
  return;
}

Assistant:

void ParsedIR::make_constant_null(uint32_t id, uint32_t type, bool add_to_typed_id_set)
{
	assert(id < ids.size());

	auto &constant_type = get<SPIRType>(type);

	if (constant_type.pointer)
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
	else if (!constant_type.array.empty())
	{
		assert(constant_type.parent_type);
		uint32_t parent_id = increase_bound_by(1);
		make_constant_null(parent_id, constant_type.parent_type, add_to_typed_id_set);

		// The array size of OpConstantNull can be either literal or specialization constant.
		// In the latter case, we cannot take the value as-is, as it can be changed to anything.
		// Rather, we assume it to be *one* for the sake of initializer.
		bool is_literal_array_size = constant_type.array_size_literal.back();
		uint32_t count = is_literal_array_size ? constant_type.array.back() : 1;

		SmallVector<uint32_t> elements(count);
		for (uint32_t i = 0; i < count; i++)
			elements[i] = parent_id;

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto& constant = variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false);
		constant.self = id;
		constant.is_null_array_specialized_length = !is_literal_array_size;
	}
	else if (!constant_type.member_types.empty())
	{
		uint32_t member_ids = increase_bound_by(uint32_t(constant_type.member_types.size()));
		SmallVector<uint32_t> elements(constant_type.member_types.size());
		for (uint32_t i = 0; i < constant_type.member_types.size(); i++)
		{
			make_constant_null(member_ids + i, constant_type.member_types[i], add_to_typed_id_set);
			elements[i] = member_ids + i;
		}

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false).self = id;
	}
	else
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
}